

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Ffmt ffmt)

{
  char *pcVar1;
  StrWriter *this_local;
  Ffmt ffmt_local;
  
  if ((this->style->syntax != GNU) && (this->style->syntax != GNU_MIT)) {
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '.';
  }
  switch(ffmt.raw) {
  case 0:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
    break;
  case 1:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 's';
    break;
  case 2:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'x';
    break;
  case 3:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'p';
    break;
  case 4:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'w';
    break;
  case 5:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'd';
    break;
  case 6:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'b';
    break;
  default:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '?';
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Ffmt ffmt)
{
    if (style.syntax != Syntax::GNU && style.syntax != Syntax::GNU_MIT) *ptr++ = '.';

    switch (ffmt.raw) {

        case 0: *ptr++ = 'l'; break;
        case 1: *ptr++ = 's'; break;
        case 2: *ptr++ = 'x'; break;
        case 3: *ptr++ = 'p'; break;
        case 4: *ptr++ = 'w'; break;
        case 5: *ptr++ = 'd'; break;
        case 6: *ptr++ = 'b'; break;

        default:
            *ptr++ = '?';
    }

    return *this;
}